

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void regress(FILE *in)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  char *pcVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  uint uVar10;
  char *f [10];
  char erbuf [100];
  regex_t re;
  char inbuf [1000];
  
  do {
    do {
      pcVar6 = fgets(inbuf,1000,(FILE *)in);
      if (pcVar6 == (char *)0x0) {
        sVar7 = regerror(2,(regex_t *)0x0,erbuf,100);
        iVar5 = bcmp(erbuf,"invalid regular expression",0x1b);
        if ((iVar5 != 0) || (sVar7 != 0x1b)) {
          fprintf(_stderr,"end: regerror() test gave `%s\' not `%s\'\n",erbuf,
                  "invalid regular expression");
          status = 1;
        }
        sVar7 = regerror(2,(regex_t *)0x0,erbuf,10);
        iVar5 = bcmp(erbuf,"invalid regular expression",9);
        if (((iVar5 != 0) || (erbuf[9] != '\0')) || (sVar7 != 0x1b)) {
          fprintf(_stderr,"end: regerror() short test gave `%s\' not `%.*s\'\n",erbuf,9,
                  "invalid regular expression");
          status = 1;
        }
        sVar7 = regerror(0x102,(regex_t *)0x0,erbuf,100);
        iVar5 = bcmp(erbuf,"REG_BADPAT",0xb);
        if ((iVar5 != 0) || (sVar7 != 0xb)) {
          fprintf(_stderr,"end: regerror() ITOA test gave `%s\' not `%s\'\n",erbuf,"REG_BADPAT");
          status = 1;
        }
        re.re_endp = "REG_BADPAT";
        sVar7 = regerror(0xff,(regex_t *)&re,erbuf,100);
        iVar5 = atoi(erbuf);
        if (iVar5 == 2) {
          sVar8 = strlen(erbuf);
          if (sVar7 == sVar8 + 1) {
            return;
          }
          pcVar6 = "end: regerror() ATOI test len(`%s\') = %ld\n";
        }
        else {
          pcVar6 = "end: regerror() ATOI test gave `%s\' not `%ld\'\n";
        }
        fprintf(_stderr,pcVar6,erbuf,2);
        status = 1;
        return;
      }
      uVar10 = line + 1;
      line = uVar10;
    } while ((inbuf[0] == '\n') || (inbuf[0] == '#'));
    sVar7 = strlen(inbuf);
    inbuf[sVar7 - 1] = '\0';
    if (debug != 0) {
      fprintf(_stdout,"%d:\n",(ulong)uVar10);
    }
    uVar10 = split(inbuf,f,10,"\t\t");
    if ((int)uVar10 < 3) {
      fprintf(_stderr,"bad input, line %d\n",(ulong)(uint)line);
      exit(1);
    }
    for (uVar9 = 0; pcVar2 = f[2], pcVar1 = f[1], pcVar6 = f[0], uVar10 != uVar9; uVar9 = uVar9 + 1)
    {
      pcVar6 = f[uVar9];
      if (((*pcVar6 == '\"') && (pcVar6[1] == '\"')) && (pcVar6[2] == '\0')) {
        f[uVar9] = "";
      }
    }
    if (uVar10 == 3) {
      f[3] = (char *)0x0;
LAB_001037b3:
      f[4] = (char *)0x0;
    }
    else if ((int)uVar10 < 5) goto LAB_001037b3;
    pcVar4 = f[4];
    pcVar3 = f[3];
    iVar5 = options(99,f[1]);
    try(pcVar6,pcVar1,pcVar2,pcVar3,pcVar4,iVar5);
    pcVar1 = f[1];
    iVar5 = opt(0x26,f[1]);
    pcVar4 = f[4];
    pcVar3 = f[3];
    pcVar2 = f[2];
    pcVar6 = f[0];
    if (iVar5 != 0) {
      uVar10 = options(99,pcVar1);
      try(pcVar6,pcVar1,pcVar2,pcVar3,pcVar4,uVar10 & 0xfffffffe);
    }
  } while( true );
}

Assistant:

void
regress(in)
FILE *in;
{
	char inbuf[1000];
#	define	MAXF	10
	char *f[MAXF];
	int nf;
	int i;
	char erbuf[100];
	size_t ne;
	char *badpat = "invalid regular expression";
#	define	SHORT	10
	char *bpname = "REG_BADPAT";
	regex_t re;

	while (fgets(inbuf, sizeof(inbuf), in) != NULL) {
		line++;
		if (inbuf[0] == '#' || inbuf[0] == '\n')
			continue;			/* NOTE CONTINUE */
		inbuf[strlen(inbuf)-1] = '\0';	/* get rid of stupid \n */
		if (debug)
			fprintf(stdout, "%d:\n", line);
		nf = split(inbuf, f, MAXF, "\t\t");
		if (nf < 3) {
			fprintf(stderr, "bad input, line %d\n", line);
			exit(1);
		}
		for (i = 0; i < nf; i++)
			if (strcmp(f[i], "\"\"") == 0)
				f[i] = "";
		if (nf <= 3)
			f[3] = NULL;
		if (nf <= 4)
			f[4] = NULL;
		try(f[0], f[1], f[2], f[3], f[4], options('c', f[1]));
		if (opt('&', f[1]))	/* try with either type of RE */
			try(f[0], f[1], f[2], f[3], f[4],
					options('c', f[1]) &~ REG_EXTENDED);
	}

	ne = regerror(REG_BADPAT, (regex_t *)NULL, erbuf, sizeof(erbuf));
	if (strcmp(erbuf, badpat) != 0 || ne != strlen(badpat)+1) {
		fprintf(stderr, "end: regerror() test gave `%s' not `%s'\n",
							erbuf, badpat);
		status = 1;
	}
	ne = regerror(REG_BADPAT, (regex_t *)NULL, erbuf, (size_t)SHORT);
	if (strncmp(erbuf, badpat, SHORT-1) != 0 || erbuf[SHORT-1] != '\0' ||
						ne != strlen(badpat)+1) {
		fprintf(stderr, "end: regerror() short test gave `%s' not `%.*s'\n",
						erbuf, SHORT-1, badpat);
		status = 1;
	}
	ne = regerror(REG_ITOA|REG_BADPAT, (regex_t *)NULL, erbuf, sizeof(erbuf));
	if (strcmp(erbuf, bpname) != 0 || ne != strlen(bpname)+1) {
		fprintf(stderr, "end: regerror() ITOA test gave `%s' not `%s'\n",
						erbuf, bpname);
		status = 1;
	}
	re.re_endp = bpname;
	ne = regerror(REG_ATOI, &re, erbuf, sizeof(erbuf));
	if (atoi(erbuf) != (int)REG_BADPAT) {
		fprintf(stderr, "end: regerror() ATOI test gave `%s' not `%ld'\n",
						erbuf, (long)REG_BADPAT);
		status = 1;
	} else if (ne != strlen(erbuf)+1) {
		fprintf(stderr, "end: regerror() ATOI test len(`%s') = %ld\n",
						erbuf, (long)REG_BADPAT);
		status = 1;
	}
}